

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

void __thiscall imrt::Station::setUniformIntensity(Station *this,double intensity)

{
  long lVar1;
  int iVar2;
  pair<int,_int> pVar3;
  long lVar4;
  long lVar5;
  int j;
  int j_00;
  
  if (0 < this->max_apertures) {
    lVar4 = 0;
    do {
      iVar2 = Collimator::getXdim(this->collimator);
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          pVar3 = Collimator::getActiveRange(this->collimator,(int)lVar5,this->angle);
          iVar2 = pVar3.second;
          if (pVar3.first <= iVar2 && -1 < pVar3.first) {
            do {
              lVar1 = *(long *)&(this->A).
                                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data;
              j_00 = pVar3.first;
              if ((*(int *)(lVar1 + lVar5 * 8) <= j_00) && (j_00 <= *(int *)(lVar1 + 4 + lVar5 * 8))
                 ) {
                change_intensity(this,(int)lVar5,j_00,intensity,
                                 (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                  *)0x0);
              }
              pVar3.first = j_00 + 1;
              pVar3.second = 0;
            } while (iVar2 + 1U != pVar3.first);
          }
          lVar5 = lVar5 + 1;
          iVar2 = Collimator::getXdim(this->collimator);
        } while (lVar5 < iVar2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->max_apertures);
  }
  return;
}

Assistant:

void Station::setUniformIntensity(double intensity){
    for (int a=0 ; a<max_apertures; a++) {
      for (int i=0; i < collimator.getXdim(); i++) {
        pair <int,int> aux = collimator.getActiveRange(i,angle);
        if (aux.first<0) continue;
        for (int j=aux.first; j<=aux.second; j++) {
          if (j>=A[a][i].first && j<=A[a][i].second){
            change_intensity(i, j, intensity);
          }
        }
      }
    }
  }